

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool AddModuleFunction(Allocator *allocator,char *module,_func_void *ptrRaw,void *funcWrap,
                      _func_void_void_ptr_char_ptr_char_ptr *ptrWrap,char *name,int index,
                      char **errorPos,char *errorBuf,uint errorBufSize,int optimizationLevel)

{
  uint uVar1;
  ByteCode *code;
  size_t sVar2;
  ExternFuncInfo *pEVar3;
  int *piVar4;
  int iVar5;
  bool bVar6;
  InplaceStr moduleName;
  uint uStack_34;
  
  code = (ByteCode *)BinaryCache::FindBytecode(module,true);
  if (code == (ByteCode *)0x0) {
    sVar2 = strlen(module);
    moduleName.end = module + sVar2;
    moduleName.begin = module;
    code = (ByteCode *)
           BuildModuleFromPath(allocator,moduleName,(char *)0x0,true,errorPos,errorBuf,errorBufSize,
                               optimizationLevel,(ArrayView<InplaceStr>)(ZEXT416(uStack_34) << 0x60)
                               ,(CompilerStatistics *)0x0);
    if (code == (ByteCode *)0x0) {
      return false;
    }
  }
  uVar1 = NULLC::GetStringHash(name);
  pEVar3 = FindFirstFunc(code);
  iVar5 = code->functionCount - code->moduleFunctionCount;
  piVar4 = &pEVar3->regVmAddress;
  do {
    bVar6 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar6) {
      if (index == -1) {
LAB_001384c2:
        bVar6 = true;
      }
      else {
        *errorPos = (char *)0x0;
        bVar6 = false;
        NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,
                           "ERROR: function \'%s\' or one of it\'s overload is not found in module \'%s\'"
                           ,name,module);
      }
      return bVar6;
    }
    if (uVar1 == piVar4[0x1e]) {
      if (index == 0) {
        *piVar4 = -1;
        *(_func_void **)(piVar4 + 6) = ptrRaw;
        *(void **)(piVar4 + 8) = funcWrap;
        *(_func_void_void_ptr_char_ptr_char_ptr **)(piVar4 + 10) = ptrWrap;
        goto LAB_001384c2;
      }
      index = index + -1;
    }
    piVar4 = piVar4 + 0x25;
  } while( true );
}

Assistant:

bool AddModuleFunction(Allocator *allocator, const char* module, void (*ptrRaw)(), void *funcWrap, void (*ptrWrap)(void *func, char* retBuf, char* argBuf), const char* name, int index, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel)
{
	const char *bytecode = BinaryCache::FindBytecode(module, true);

	// Create module if not found
	if(!bytecode)
		bytecode = BuildModuleFromPath(allocator, InplaceStr(module), NULL, true, errorPos, errorBuf, errorBufSize, optimizationLevel, ArrayView<InplaceStr>(), NULL);

	if(!bytecode)
		return false;

	unsigned hash = NULLC::GetStringHash(name);
	ByteCode *code = (ByteCode*)bytecode;

	// Find function and set pointer
	ExternFuncInfo *fInfo = FindFirstFunc(code);

	unsigned end = code->functionCount - code->moduleFunctionCount;
	for(unsigned i = 0; i < end; i++)
	{
		if(hash == fInfo->nameHash)
		{
			if(index == 0)
			{
				fInfo->regVmAddress = -1;

				fInfo->funcPtrRaw = ptrRaw;
				fInfo->funcPtrWrapTarget = funcWrap;
				fInfo->funcPtrWrap = ptrWrap;

				index--;
				break;
			}

			index--;
		}

		fInfo++;
	}

	if(index != -1)
	{
		*errorPos = NULL;

		NULLC::SafeSprintf(errorBuf, errorBufSize, "ERROR: function '%s' or one of it's overload is not found in module '%s'", name, module);

		return false;
	}

	return true;
}